

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

string * testing::internal::FormatFileLocation_abi_cxx11_(char *file,int line)

{
  int in_EDX;
  char *in_RSI;
  string *in_RDI;
  string file_name;
  allocator *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  string local_90 [32];
  string local_70 [32];
  undefined4 local_50;
  allocator local_39;
  string local_38 [36];
  int local_14;
  
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    in_RSI = "unknown file";
  }
  __rhs = &local_39;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI;
  local_14 = in_EDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,in_RSI,__rhs);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (local_14 < 0) {
    std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  }
  else {
    std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    StreamableToString<int>((int *)in_stack_ffffffffffffff58);
    std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::operator+(__lhs,(char *)__rhs);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
    std::__cxx11::string::~string(local_90);
  }
  local_50 = 1;
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

GTEST_API_ ::std::string FormatFileLocation(const char* file, int line) {
  const std::string file_name(file == NULL ? kUnknownFile : file);

  if (line < 0) {
    return file_name + ":";
  }
#ifdef _MSC_VER
  return file_name + "(" + StreamableToString(line) + "):";
#else
  return file_name + ":" + StreamableToString(line) + ":";
#endif  // _MSC_VER
}